

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  char *pcVar1;
  char *pcVar2;
  const_iterator cVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *pcVar5;
  bool bVar6;
  
  pcVar5 = pos->_M_current;
  pcVar1 = (this->_first)._M_current;
  pcVar2 = (this->_last)._M_current;
  bVar6 = (this->_prefix)._M_current == pcVar5;
  if (pcVar2 == pcVar5) {
    return (const_iterator)pcVar5;
  }
  if ((pcVar1 == pcVar5) && (pcVar1 < (this->_prefix)._M_current)) {
    cVar3._M_current = (this->_prefix)._M_current;
  }
  else {
    cVar3._M_current = pcVar5 + 1;
    if (*pcVar5 != '/') {
      if (((pcVar1 == pcVar5 || bVar6) && cVar3._M_current != pcVar2) && (*cVar3._M_current == ':'))
      {
        return (const_iterator)(pcVar5 + 2);
      }
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (cVar3._M_current,pcVar2,"/A18_c");
      return (const_iterator)_Var4._M_current;
    }
    if ((cVar3._M_current != pcVar2) && (*cVar3._M_current == '/')) {
      if ((pcVar1 == pcVar5 || bVar6) &&
         ((pcVar5 = pcVar5 + 2, pcVar5 == pcVar2 || (*pcVar5 != '/')))) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar5,pcVar2,"/A18_c");
        return (const_iterator)_Var4._M_current;
      }
      if (cVar3._M_current != pcVar2) {
        while (*cVar3._M_current == '/') {
          cVar3._M_current = cVar3._M_current + 1;
          if (cVar3._M_current == pcVar2) {
            return (const_iterator)pcVar2;
          }
        }
      }
    }
  }
  return (const_iterator)cVar3._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first || i == _prefix;
    if (i != _last) {
        if (fromStart && i == _first && _prefix > _first) {
            i = _prefix;
        }
        else if (*i++ == preferred_separator) {
            // we can only sit on a slash if it is a network name or a root
            if (i != _last && *i == preferred_separator) {
                if (fromStart && !(i + 1 != _last && *(i + 1) == preferred_separator)) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, preferred_separator);
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == preferred_separator) {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, preferred_separator);
            }
        }
    }
    return i;
}